

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O0

int64_t file_size(char *path)

{
  int iVar1;
  undefined1 local_a8 [8];
  stat sb;
  char *path_local;
  
  sb.__glibc_reserved[2] = (__syscall_slong_t)path;
  iVar1 = stat(path,(stat *)local_a8);
  if (iVar1 < 0) {
    path_local = (char *)0xffffffffffffffff;
  }
  else {
    path_local = (char *)sb.st_rdev;
  }
  return (int64_t)path_local;
}

Assistant:

int64_t file_size (const char *path) {
    #ifdef WIN32
    WIN32_FILE_ATTRIBUTE_DATA fileInfo;
    if (GetFileAttributesExA(path, GetFileExInfoStandard, (void*)&fileInfo) == 0) return -1;
    return (int64_t)(((__int64)fileInfo.nFileSizeHigh) << 32 ) + fileInfo.nFileSizeLow;
    #else
    struct stat sb;
    if (stat(path, &sb) < 0) return -1;
    return (int64_t)sb.st_size;
    #endif
}